

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# areadump.cc
# Opt level: O2

int main(int argc,char **argv)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  File *pFVar3;
  pointer pbVar4;
  bool bVar5;
  int iVar6;
  mapped_type *this;
  ulong uVar7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  long lVar10;
  pointer file;
  __normal_iterator<lrit::File_*,_std::vector<lrit::File,_std::allocator<lrit::File>_>_> __i;
  _Base_ptr p_Var11;
  File *this_00;
  ImageStructureHeader IVar12;
  allocator local_1f9;
  char **local_1f8;
  long local_1f0;
  SegmentIdentificationHeader sih;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  map<int,_std::vector<lrit::File,_std::allocator<lrit::File>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>_>
  all;
  uint local_170 [6];
  Dir dir;
  pointer local_128;
  HeaderMap local_108;
  stat st;
  
  all._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &all._M_t._M_impl.super__Rb_tree_header._M_header;
  all._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  all._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  all._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar10 = 1;
  local_1f8 = argv;
  all._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       all._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if (argc <= lVar10) {
      for (p_Var9 = all._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &all._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        p_Var1 = p_Var9[1]._M_parent;
        p_Var2 = p_Var9[1]._M_left;
        if (p_Var1 != p_Var2) {
          uVar7 = ((long)p_Var2 - (long)p_Var1) / 0x98;
          lVar10 = 0x3f;
          if (uVar7 != 0) {
            for (; uVar7 >> lVar10 == 0; lVar10 = lVar10 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<lrit::File*,std::vector<lrit::File,std::allocator<lrit::File>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                    (p_Var1,p_Var2,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
          if ((long)p_Var2 - (long)p_Var1 < 0x981) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<lrit::File*,std::vector<lrit::File,std::allocator<lrit::File>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                      (p_Var1,p_Var2);
          }
          else {
            p_Var11 = p_Var1 + 0x4c;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<lrit::File*,std::vector<lrit::File,std::allocator<lrit::File>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                      (p_Var1,p_Var11);
            for (; p_Var11 != p_Var2; p_Var11 = (_Base_ptr)&p_Var11[4]._M_right) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<lrit::File*,std::vector<lrit::File,std::allocator<lrit::File>>>,__gnu_cxx::__ops::_Val_comp_iter<main::__0>>
                        (p_Var11);
            }
          }
        }
        lrit::File::getHeader<lrit::SegmentIdentificationHeader>
                  ((SegmentIdentificationHeader *)&st,(File *)p_Var9[1]._M_parent);
        this_00 = (File *)p_Var9[1]._M_parent;
        pFVar3 = (File *)p_Var9[1]._M_left;
        if (((long)pFVar3 - (long)this_00) / 0x98 == (ulong)st.st_ino._4_2_) {
          sih.headerType = '\0';
          sih._1_1_ = 0;
          sih.headerLength = 0;
          sih.imageIdentifier = 0;
          sih.segmentNumber = 0;
          sih.segmentStartColumn = 0;
          sih.segmentStartLine = 0;
          sih.maxSegment = 0;
          sih.maxColumn = 0;
          for (; this_00 != pFVar3; this_00 = this_00 + 1) {
            IVar12 = lrit::File::getHeader<lrit::ImageStructureHeader>(this_00);
            lrit::File::getHeader<lrit::ImageNavigationHeader>
                      ((ImageNavigationHeader *)&dir,this_00);
            lrit::File::getHeader<lrit::NOAALRITHeader>(this_00);
            iVar6 = (int)((ulong)local_128 >> 0x20);
            result.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44((uint)IVar12.columns - (int)local_128,-(int)local_128);
            result.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish._0_4_ = -iVar6;
            result.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish._4_4_ = (IVar12._8_4_ & 0xffff) - iVar6;
            if (sih._12_4_ == sih._8_4_) {
              sih._8_8_ = result.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              sih._0_8_ = result.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            }
            else {
              sih._0_16_ = Area::getUnion((Area *)&sih,(Area *)&result);
            }
            std::__cxx11::string::~string((string *)&dir.path_._M_string_length);
          }
          std::operator<<((ostream *)&std::cout,"crop = [ ");
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sih._0_4_);
          std::operator<<(poVar8,", ");
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sih._4_4_);
          std::operator<<(poVar8,", ");
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sih._8_4_);
          std::operator<<(poVar8,", ");
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sih._12_4_);
          std::operator<<(poVar8," ]");
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>_>
      ::~_Rb_tree(&all._M_t);
      return 0;
    }
    local_1f0 = lVar10;
    iVar6 = stat(local_1f8[lVar10],(stat *)&st);
    if (iVar6 < 0) break;
    result.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    result.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    result.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((st.st_mode & 0xf000) == 0x4000) {
      std::__cxx11::string::string((string *)&sih,local_1f8[local_1f0],(allocator *)local_170);
      Dir::Dir(&dir,(string *)&sih);
      std::__cxx11::string::~string((string *)&sih);
      std::__cxx11::string::string((string *)&sih,"*.lrit*",&local_1f9);
      Dir::matchFiles((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_170,&dir,(string *)&sih);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&result,(allocator *)local_170);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_170);
      std::__cxx11::string::~string((string *)&sih);
      Dir::~Dir(&dir);
    }
    else {
      std::__cxx11::string::string((string *)&dir,local_1f8[local_1f0],(allocator *)&sih);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&result,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dir);
      std::__cxx11::string::~string((string *)&dir);
    }
    pbVar4 = result.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (file = result.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; file != pbVar4; file = file + 1) {
      lrit::File::File((File *)&dir,file);
      bVar5 = lrit::hasHeader<lrit::ImageNavigationHeader>(&local_108);
      if (bVar5) {
        lrit::File::getHeader<lrit::SegmentIdentificationHeader>(&sih,(File *)&dir);
        local_170[0] = (uint)sih.imageIdentifier;
        this = std::
               map<int,_std::vector<lrit::File,_std::allocator<lrit::File>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>_>
               ::operator[](&all,(key_type *)local_170);
        std::vector<lrit::File,_std::allocator<lrit::File>_>::emplace_back<lrit::File>
                  (this,(File *)&dir);
      }
      lrit::File::~File((File *)&dir);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&result);
    lVar10 = local_1f0 + 1;
  }
  perror("stat");
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
  std::map<int, std::vector<lrit::File>> all;

  // Group files by their image identifier
  for (int i = 1; i < argc; i++) {
    struct stat st;
    auto rv = stat(argv[i], &st);
    if (rv < 0) {
      perror("stat");
      exit(1);
    }

    std::vector<std::string> result;
    if (S_ISDIR(st.st_mode)) {
      Dir dir(argv[i]);
      result = dir.matchFiles("*.lrit*");
    } else {
      result.push_back(argv[i]);
    }

    for (const auto& path : result) {
      auto file = lrit::File(path);
      if (!file.hasHeader<lrit::ImageNavigationHeader>()) {
        continue;
      }

      auto sih = file.getHeader<lrit::SegmentIdentificationHeader>();
      auto& files = all[sih.imageIdentifier];
      files.push_back(std::move(file));
    }
  }

  // Compute area for all images
  for (auto& it : all) {
    auto& files = it.second;

    // Sort by segment identifier
    std::sort(
      files.begin(),
      files.end(),
      [](const auto& a, const auto& b) -> bool {
        auto sa = a.template getHeader<lrit::SegmentIdentificationHeader>();
        auto sb = b.template getHeader<lrit::SegmentIdentificationHeader>();
        return sa.segmentNumber < sb.segmentNumber;
      });

    // Ignore incomplete images
    auto si = files[0].getHeader<lrit::SegmentIdentificationHeader>();
    if (files.size() != si.maxSegment) {
      continue;
    }

    // Compute area covered by this segmented image.
    // Largely copied from the original version of goesproc,
    // which was removed in eaa56cb2.
    Area area;
    for (auto& file : files) {
      auto is = file.getHeader<lrit::ImageStructureHeader>();
      auto in = file.getHeader<lrit::ImageNavigationHeader>();
      auto nl = file.getHeader<lrit::NOAALRITHeader>();

      // Update relative area represented by this image
      Area tmp;
      tmp.minColumn = -in.columnOffset;
      tmp.maxColumn = -in.columnOffset + is.columns;
      tmp.minLine = -in.lineOffset;
      tmp.maxLine = -in.lineOffset + is.lines;

      // For Himawari-8, the line offset is an int32_t and can be negative
      if (nl.productID == 43) {
        tmp.minLine = -(int32_t)in.lineOffset;
        tmp.maxLine = -(int32_t)in.lineOffset + is.lines;
      }

      if (area.height() == 0) {
        area = tmp;
      } else {
        area = area.getUnion(tmp);
      }
    }

    std::cout << "crop = [ ";
    std::cout << area.minColumn << ", ";
    std::cout << area.maxColumn << ", ";
    std::cout << area.minLine << ", ";
    std::cout << area.maxLine << " ]";
    std::cout << std::endl;
  }
}